

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_stricmp(char *zLeft,char *zRight)

{
  byte bVar1;
  long lVar2;
  
  if (zLeft == (char *)0x0) {
    return -(uint)(zRight != (char *)0x0);
  }
  if (zRight != (char *)0x0) {
    lVar2 = 0;
    do {
      bVar1 = zLeft[lVar2];
      if (bVar1 == zRight[lVar2]) {
        if ((ulong)bVar1 == 0) {
          return 0;
        }
      }
      else if ((uint)""[bVar1] - (uint)""[(byte)zRight[lVar2]] != 0) {
        return (uint)""[bVar1] - (uint)""[(byte)zRight[lVar2]];
      }
      lVar2 = lVar2 + 1;
    } while( true );
  }
  return 1;
}

Assistant:

SQLITE_API int sqlite3_stricmp(const char *zLeft, const char *zRight){
  if( zLeft==0 ){
    return zRight ? -1 : 0;
  }else if( zRight==0 ){
    return 1;
  }
  return sqlite3StrICmp(zLeft, zRight);
}